

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStems<unsigned_int>
               (char *label_id,uint *values,int count,double y_ref,double xscale,double x0,
               int offset,int stride)

{
  undefined1 local_88 [8];
  GetterYRef get_base;
  GetterYs<unsigned_int> get_mark;
  int stride_local;
  int offset_local;
  double x0_local;
  double xscale_local;
  double y_ref_local;
  int count_local;
  uint *values_local;
  char *label_id_local;
  
  GetterYs<unsigned_int>::GetterYs
            ((GetterYs<unsigned_int> *)&get_base.X0,values,count,xscale,x0,offset,stride);
  GetterYRef::GetterYRef((GetterYRef *)local_88,y_ref,count,xscale,x0);
  PlotStemsEx<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef>
            (label_id,(GetterYs<unsigned_int> *)&get_base.X0,(GetterYRef *)local_88);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* values, int count, double y_ref, double xscale, double x0, int offset, int stride) {
    GetterYs<T> get_mark(values,count,xscale,x0,offset,stride);
    GetterYRef get_base(y_ref,count,xscale,x0);
    PlotStemsEx(label_id, get_mark, get_base);
}